

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O2

error<idx2::idx2_err_code> idx2::ParallelDecode(idx2_file *Idx2,params *P,buffer *OutBuf)

{
  brick_pool *Bp;
  cstr pcVar1;
  cstr pcVar2;
  char *__s;
  long *in_FS_OFFSET;
  error<idx2::mmap_err_code> eVar3;
  unique_lock<std::mutex> Lock;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:520:3)>
  __ScopeGuard__520;
  volume local_388;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:493:3)>
  local_358;
  timer DecodeTimer;
  grid OutGrid;
  timespec local_318;
  mmap_volume OutVolFile;
  decode_data D;
  
  clock_gettime(1,(timespec *)&DecodeTimer);
  GetGrid(&OutGrid,Idx2,&P->DecodeExtent);
  mmap_volume::mmap_volume(&OutVolFile);
  Mallocator();
  local_388.Buffer.Data = (byte *)0x0;
  local_388.Buffer.Bytes = 0;
  local_388.Buffer.Alloc = &Mallocator::Instance.super_allocator;
  local_388.Dims = 0;
  local_388.Type = __Invalid__;
  local_358.Dismissed = false;
  local_358.Func.P = P;
  local_358.Func.OutVolFile = &OutVolFile;
  if (P->OutMode == RegularGridMem) {
    local_388.Buffer.Alloc = OutBuf->Alloc;
    local_388.Buffer.Data = OutBuf->Data;
    local_388.Buffer.Bytes = OutBuf->Bytes;
    local_388.Dims = OutGrid.super_extent.Dims & 0x7fffffffffffffff;
    local_388.Type = Idx2->DType;
  }
  else if (P->OutMode == RegularGridFile) {
    D.Alloc = *(allocator **)Idx2->Name;
    D.FileCacheTable.Keys = *(unsigned_long **)(Idx2->Name + 8);
    D.FileCacheTable.Vals = *(file_cache **)(Idx2->Name + 0x10);
    D.FileCacheTable.Stats = *(bucket_status **)(Idx2->Name + 0x18);
    D.FileCacheTable.Size = *(i64 *)(Idx2->Name + 0x20);
    D.FileCacheTable.LogCapacity = *(i64 *)(Idx2->Name + 0x28);
    D.FileCacheTable.Alloc = *(allocator **)(Idx2->Name + 0x30);
    D.BrickPool.BrickTable.Keys = *(unsigned_long **)(Idx2->Name + 0x38);
    D.BrickPool.BrickTable.Vals = *(brick_volume **)Idx2->Field;
    D.BrickPool.BrickTable.Stats = *(bucket_status **)(Idx2->Field + 8);
    D.BrickPool.BrickTable.Size = *(i64 *)(Idx2->Field + 0x10);
    D.BrickPool.BrickTable.LogCapacity = *(i64 *)(Idx2->Field + 0x18);
    D.BrickPool.BrickTable.Alloc = *(allocator **)(Idx2->Field + 0x20);
    D.BrickPool.ResolutionLevels.Buffer.Data = *(byte **)(Idx2->Field + 0x28);
    D.BrickPool.ResolutionLevels.Buffer.Bytes = *(i64 *)(Idx2->Field + 0x30);
    D.BrickPool.ResolutionLevels.Buffer.Alloc = *(allocator **)(Idx2->Field + 0x38);
    D.BrickPool.ResolutionLevels.Size =
         (long)(OutGrid.super_extent.Dims << 0x16) >> 0xb & 0xffffffff00000000U |
         (ulong)(uint)((long)(OutGrid.super_extent.Dims << 0x2b) >> 0x2b);
    D.BrickPool.ResolutionLevels.Capacity._0_4_ =
         (int)((long)(OutGrid.super_extent.Dims * 2) >> 0x2b);
    D.BrickPool.ResolutionLevels.Capacity._4_1_ = Idx2->DType;
    if (P->OutFile == (cstr)0x0) {
      pcVar1 = P->OutDir;
      pcVar2 = ToRawFileName((metadata *)&D);
      __s = (char *)(*in_FS_OFFSET + -0xf80);
      snprintf(__s,0x400,"%s/%s-tolerance-%f.raw",P->DecodeTolerance,pcVar1,pcVar2);
    }
    else {
      __s = (char *)(*in_FS_OFFSET + -0xf80);
      snprintf(__s,0x400,"%s/%s",P->OutDir,P->OutFile);
    }
    eVar3 = MapVolume(__s,(v3i *)&D.BrickPool.ResolutionLevels.Size,
                      D.BrickPool.ResolutionLevels.Capacity._4_1_,&OutVolFile,Write);
    printf("writing output volume to %s\n",__s,eVar3._8_8_);
  }
  decode_data::decode_data(&D);
  __ScopeGuard__520.Dismissed = false;
  __ScopeGuard__520.Func.D = &D;
  Mallocator();
  Init(&D,Idx2,&Mallocator::Instance.super_allocator);
  TraverseFirstLevel(Idx2,P,&D,&OutGrid,&OutVolFile,&local_388);
  std::unique_lock<std::mutex>::unique_lock(&Lock,&D.Mutex);
  while (D.NTasks != 0) {
    std::condition_variable::wait((unique_lock *)&D.AllTasksDone);
  }
  if (P->OutMode == HashMap) {
    Bp = &D.BrickPool;
    PrintStatistics(Bp);
    ComputeBrickResolution(Bp);
    WriteBricks(Bp,"bricks");
  }
  clock_gettime(1,&local_318);
  printf("total decode time   = %f\n",
         (double)(long)((double)(local_318.tv_sec - DecodeTimer.Start.tv_sec) * 1000000000.0 +
                       (double)(local_318.tv_nsec - DecodeTimer.Start.tv_nsec)) / 1000000000.0);
  printf("io time             = %f\n",
         (double)(long)D.DecodeIOTime_.super___atomic_base<unsigned_long>._M_i / 1000000000.0);
  printf("data movement time  = %f\n",
         (double)(long)D.DataMovementTime_.super___atomic_base<unsigned_long>._M_i / 1000000000.0);
  printf("exp   bytes read    = %li\n",D.BytesExps_.super___atomic_base<unsigned_long>._M_i);
  printf("data  bytes read    = %li\n",D.BytesData_.super___atomic_base<unsigned_long>._M_i);
  printf("total bytes read    = %li\n",
         (long)D.BytesData_.super___atomic_base<unsigned_long>._M_i +
         (long)D.BytesExps_.super___atomic_base<unsigned_long>._M_i);
  printf("total bytes decoded = %li\n",
         (ulong)D.BytesDecoded_.super___atomic_base<unsigned_long>._M_i >> 3);
  printf("final size of brick hashmap = %li\n",D.BrickPool.BrickTable.Size);
  printf("number of significant blocks = %li\n",D.NSignificantBlocks.super___atomic_base<long>._M_i)
  ;
  printf("number of insignificant subbands = %li\n",
         D.NInsignificantSubbands.super___atomic_base<long>._M_i);
  *(char **)(*in_FS_OFFSET + -0x400) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x222;
  std::unique_lock<std::mutex>::~unique_lock(&Lock);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:520:3)>
  ::~scope_guard(&__ScopeGuard__520);
  decode_data::~decode_data(&D);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:493:3)>
  ::~scope_guard(&local_358);
  return (error<idx2::idx2_err_code>)ZEXT816(0x19942d);
}

Assistant:

error<idx2_err_code>
ParallelDecode(const idx2_file& Idx2, const params& P, buffer* OutBuf)
{
  timer DecodeTimer;
  StartTimer(&DecodeTimer);
  // TODO: we should add a --effective-mask
  grid OutGrid = GetGrid(Idx2, P.DecodeExtent);
  // printf("output grid = " idx2_PrStrGrid "\n", idx2_PrGrid(OutGrid));
  mmap_volume OutVolFile;
  volume OutVolMem;
  idx2_CleanUp(if (P.OutMode == params::out_mode::RegularGridFile) { Unmap(&OutVolFile); });

  if (P.OutMode == params::out_mode::RegularGridFile)
  {
    metadata Met;
    memcpy(Met.Name, Idx2.Name, sizeof(Met.Name));
    memcpy(Met.Field, Idx2.Field, sizeof(Met.Field));
    Met.Dims3 = Dims(OutGrid);
    Met.DType = Idx2.DType;
    //  printf("zfp decode time = %f\n", DecodeTime_);
    cstr OutFile = P.OutFile
                     ? idx2_PrintScratch("%s/%s", P.OutDir, P.OutFile)
                     : idx2_PrintScratch(
                         "%s/%s-tolerance-%f.raw", P.OutDir, ToRawFileName(Met), P.DecodeTolerance);
    //    idx2_RAII(mmap_volume, OutVol, (void)OutVol, Unmap(&OutVol));
    MapVolume(OutFile, Met.Dims3, Met.DType, &OutVolFile, map_mode::Write);
    printf("writing output volume to %s\n", OutFile);
  }
  else if (P.OutMode == params::out_mode::RegularGridMem)
  {
    OutVolMem.Buffer = *OutBuf;
    SetDims(&OutVolMem, Dims(OutGrid));
    OutVolMem.Type = Idx2.DType;
  }

  const int BrickBytes = Prod(Idx2.BrickDimsExt3) * sizeof(f64);
  // for now the allocator seems not a bottleneck
  idx2_RAII(decode_data, D, Init(&D, &Idx2, &Mallocator()));

  TraverseFirstLevel(Idx2, P, &D, OutGrid, &OutVolFile, &OutVolMem);

  std::unique_lock<std::mutex> Lock(D.Mutex);
  D.AllTasksDone.wait(Lock, [&D]{ return D.NTasks == 0; });
  //stlab::pre_exit();

  if (P.OutMode == params::out_mode::HashMap)
  {
    PrintStatistics(&D.BrickPool);
    ComputeBrickResolution(&D.BrickPool);
    WriteBricks(&D.BrickPool, "bricks");
  }

  printf("total decode time   = %f\n", Seconds(ElapsedTime(&DecodeTimer)));
  printf("io time             = %f\n", Seconds(D.DecodeIOTime_.load()));
  printf("data movement time  = %f\n", Seconds(D.DataMovementTime_.load()));
  printf("exp   bytes read    = %" PRIi64 "\n", D.BytesExps_.load());
  printf("data  bytes read    = %" PRIi64 "\n", D.BytesData_.load());
  printf("total bytes read    = %" PRIi64 "\n", D.BytesExps_.load() + D.BytesData_.load());
  printf("total bytes decoded = %" PRIi64 "\n", D.BytesDecoded_.load() / 8);
  printf("final size of brick hashmap = %" PRIi64 "\n", Size(D.BrickPool.BrickTable));
  printf("number of significant blocks = %" PRIi64 "\n", D.NSignificantBlocks.load());
  printf("number of insignificant subbands = %" PRIi64 "\n", D.NInsignificantSubbands.load());

  return idx2_Error(err_code::NoError);
}